

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamToolsIndex_p.cpp
# Opt level: O3

void __thiscall BamTools::Internal::BamToolsIndex::WriteHeader(BamToolsIndex *this)

{
  IBamIODevice *pIVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ulong uVar6;
  undefined4 extraout_var_02;
  BamException *this_00;
  int32_t numReferences;
  uint32_t blockSize;
  int32_t currentVersion;
  uint local_74;
  uint local_70;
  Version local_6c;
  string local_68;
  string local_48;
  
  pIVar1 = (this->m_resources).Device;
  iVar2 = (*pIVar1->_vptr_IBamIODevice[8])(pIVar1,"BTI\x01",4);
  local_6c = this->m_outputVersion;
  if (this->m_isBigEndian == true) {
    local_6c = local_6c << 0x18 | (int)local_6c >> 0x18 | (local_6c & 0xff00) << 8 |
               local_6c >> 8 & 0xff00;
  }
  pIVar1 = (this->m_resources).Device;
  iVar3 = (*pIVar1->_vptr_IBamIODevice[8])(pIVar1,&local_6c,4);
  local_70 = this->m_blockSize;
  if (this->m_isBigEndian == true) {
    local_70 = local_70 >> 0x18 | (local_70 & 0xff0000) >> 8 | (local_70 & 0xff00) << 8 |
               local_70 << 0x18;
  }
  pIVar1 = (this->m_resources).Device;
  iVar4 = (*pIVar1->_vptr_IBamIODevice[8])(pIVar1,&local_70,4);
  uVar6 = (long)(this->m_indexFileSummary).
                super__Vector_base<BamTools::Internal::BtiReferenceSummary,_std::allocator<BamTools::Internal::BtiReferenceSummary>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->m_indexFileSummary).
                super__Vector_base<BamTools::Internal::BtiReferenceSummary,_std::allocator<BamTools::Internal::BtiReferenceSummary>_>
                ._M_impl.super__Vector_impl_data._M_start;
  local_74 = (uint)(uVar6 >> 4);
  if (this->m_isBigEndian == true) {
    local_74 = local_74 << 0x18 | (int)local_74 >> 0x18 | (local_74 & 0xff00) << 8 |
               (uint)(uVar6 >> 0xc) & 0xff00;
  }
  pIVar1 = (this->m_resources).Device;
  iVar5 = (*pIVar1->_vptr_IBamIODevice[8])(pIVar1,&local_74,4);
  if (CONCAT44(extraout_var_00,iVar3) + CONCAT44(extraout_var,iVar2) +
      CONCAT44(extraout_var_01,iVar4) + CONCAT44(extraout_var_02,iVar5) == 0x10) {
    return;
  }
  this_00 = (BamException *)__cxa_allocate_exception(0x28);
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,"BamToolsIndex::WriteHeader","");
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"could not write BTI header","");
  BamException::BamException(this_00,&local_68,&local_48);
  __cxa_throw(this_00,&BamException::typeinfo,BamException::~BamException);
}

Assistant:

void BamToolsIndex::WriteHeader()
{

    int64_t numBytesWritten = 0;

    // write BTI index format 'magic number'
    numBytesWritten += m_resources.Device->Write(BamToolsIndex::BTI_MAGIC, 4);

    // write BTI index format version
    int32_t currentVersion = (int32_t)m_outputVersion;
    if (m_isBigEndian) SwapEndian_32(currentVersion);
    numBytesWritten +=
        m_resources.Device->Write((const char*)&currentVersion, sizeof(currentVersion));

    // write block size
    uint32_t blockSize = m_blockSize;
    if (m_isBigEndian) SwapEndian_32(blockSize);
    numBytesWritten += m_resources.Device->Write((const char*)&blockSize, sizeof(blockSize));

    // write number of references
    int32_t numReferences = m_indexFileSummary.size();
    if (m_isBigEndian) SwapEndian_32(numReferences);
    numBytesWritten +=
        m_resources.Device->Write((const char*)&numReferences, sizeof(numReferences));

    // check header written ok
    const int expectedBytes =
        4 + sizeof(currentVersion) + sizeof(blockSize) + sizeof(numReferences);
    if (numBytesWritten != expectedBytes)
        throw BamException("BamToolsIndex::WriteHeader", "could not write BTI header");
}